

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckHeader.cxx
# Opt level: O0

bool __thiscall
kws::Parser::CheckHeader(Parser *this,char *filename,bool considerSpaceEOL,bool useCVS)

{
  char cVar1;
  undefined8 uVar2;
  bool bVar3;
  byte bVar4;
  bool bVar5;
  __type _Var6;
  _Ios_Openmode _Var7;
  ostream *poVar8;
  long lVar9;
  size_t sVar10;
  char *pcVar11;
  ulong uVar12;
  unsigned_long uVar13;
  reference pcVar14;
  reference pbVar15;
  reference pvVar16;
  size_type sVar17;
  reference pvVar18;
  byte in_CL;
  byte in_DL;
  char *in_RSI;
  long in_RDI;
  undefined1 auVar19 [16];
  const_iterator itErr;
  const_iterator itErrV;
  uint i;
  int minErrors;
  uint header;
  const_iterator itErr_1;
  Error error_1;
  Error error;
  string word;
  long posw2;
  long posw;
  string wordh;
  long poshw2;
  long poshw;
  long l;
  const_iterator ittemp_1;
  const_iterator ittemp;
  bool isAtEnd;
  long pos3;
  long pos2;
  long line;
  uint posh;
  uint pos;
  const_iterator it;
  const_iterator ith;
  ErrorVectorType tempErrorVector;
  string buffer;
  char *buf;
  unsigned_long fileSize;
  ifstream file_1;
  const_iterator itFilename;
  vector<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>,_std::allocator<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>_>
  tempErrors;
  string fullpath;
  string file;
  uint i_1;
  string dirname;
  Directory directory;
  unsigned_long j;
  string headerFilename;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fileNames;
  bool hasError;
  char *val;
  size_t length;
  undefined6 in_stack_fffffffffffff768;
  undefined1 in_stack_fffffffffffff76e;
  undefined1 in_stack_fffffffffffff76f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff770;
  value_type *in_stack_fffffffffffff778;
  undefined4 in_stack_fffffffffffff780;
  undefined1 in_stack_fffffffffffff784;
  undefined1 in_stack_fffffffffffff785;
  undefined1 in_stack_fffffffffffff786;
  undefined1 in_stack_fffffffffffff787;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff788;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff790;
  Parser *in_stack_fffffffffffff798;
  bool local_84c;
  bool local_84b;
  bool local_84a;
  bool local_849;
  bool local_843;
  bool local_842;
  bool local_841;
  pointer buffer_00;
  Parser *this_00;
  string *in_stack_fffffffffffff7f8;
  string *in_stack_fffffffffffff800;
  undefined7 in_stack_fffffffffffff808;
  undefined1 in_stack_fffffffffffff80f;
  __normal_iterator<const_kws::ErrorStruct_*,_std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>
  local_740;
  vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> *local_738;
  vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> *local_730;
  vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> *local_728;
  __normal_iterator<const_std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_*,_std::vector<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>,_std::allocator<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>_>_>
  local_720;
  uint local_714;
  int local_710;
  uint local_70c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_708;
  ErrorStruct *local_700;
  ErrorStruct *local_6f8;
  ErrorStruct *local_6f0;
  __normal_iterator<const_kws::ErrorStruct_*,_std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>
  local_6e8;
  undefined8 local_6e0;
  undefined8 local_6d8;
  undefined8 local_6d0;
  string local_6c8 [32];
  undefined8 local_6a8;
  char *local_6a0;
  undefined8 local_698;
  char *local_690;
  undefined8 local_688;
  char *local_680;
  undefined8 local_678;
  char *local_670;
  undefined8 local_668;
  long local_660;
  long local_658;
  undefined8 local_650;
  string local_648 [32];
  string local_628 [32];
  string local_608 [39];
  undefined1 local_5e1 [33];
  long local_5c0;
  long local_5b8;
  string local_5b0 [32];
  string local_590 [39];
  allocator local_569;
  string local_568 [32];
  long local_548;
  long local_540;
  long local_538;
  char *local_530;
  undefined8 local_528;
  char *local_520;
  undefined8 local_518;
  char *local_510;
  undefined8 local_508;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_500;
  char *local_4f8;
  undefined8 local_4f0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4e8;
  byte local_4d9;
  char *local_4d8;
  undefined8 local_4d0;
  char *local_4c8;
  undefined8 local_4c0;
  char *local_4b8;
  undefined8 local_4b0;
  char *local_4a8;
  undefined8 local_4a0;
  ulong local_498;
  ulong local_490;
  char *local_488;
  undefined8 local_480;
  char *local_478;
  undefined8 local_470;
  char *local_468;
  char *local_460;
  undefined8 local_458;
  undefined8 local_450;
  long local_448;
  uint local_440;
  int local_43c;
  undefined8 local_438;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_430;
  undefined8 local_428;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_420 [4];
  undefined1 local_3f9;
  undefined1 local_3f8 [40];
  undefined1 local_3d0 [16];
  long local_3c0;
  int local_3b4;
  char local_3b0 [528];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1a0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_198;
  vector<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>,_std::allocator<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>_>
  local_190;
  string local_178 [32];
  string local_158 [39];
  allocator local_131;
  string local_130 [40];
  string local_108 [39];
  allocator local_e1;
  string local_e0 [32];
  Status local_c0;
  string local_b0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_90;
  allocator local_71;
  string local_70 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  undefined1 local_31 [23];
  byte local_1a;
  byte local_19;
  char *local_18;
  undefined1 local_1;
  
  local_19 = in_DL & 1;
  local_1a = in_CL & 1;
  *(undefined1 *)(in_RDI + 0x3d) = 1;
  local_31._9_8_ = 0xff;
  local_18 = in_RSI;
  local_31._1_8_ = operator_new__(0xff);
  snprintf((char *)local_31._1_8_,0xff,"The header should respect the template");
  std::__cxx11::string::operator=((string *)(in_RDI + 0x1f8),(char *)local_31._1_8_);
  if ((char *)local_31._1_8_ != (char *)0x0) {
    operator_delete__((void *)local_31._1_8_);
  }
  local_31[0] = 0;
  if (local_18 == (char *)0x0) {
    poVar8 = std::operator<<((ostream *)&std::cout,
                             "CheckHeader(): Please specify an header file or a directory containing headers"
                            );
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    local_1 = (_Alloc_hider)0x0;
LAB_001a02a6:
    return (bool)(local_1 & 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x19e33d);
  pcVar11 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,pcVar11,&local_71);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  lVar9 = std::__cxx11::string::find((char)local_70,0x20);
  if (lVar9 == -1) {
    std::__cxx11::string::operator=(local_70,"");
    for (local_90._0_8_ = 0; uVar2 = local_90._0_8_, sVar10 = strlen(local_18),
        (ulong)uVar2 < sVar10; local_90._M_allocated_capacity = local_90._0_8_ + 1) {
      if (local_18[local_90._0_8_] != '\"') {
        std::__cxx11::string::operator+=(local_70,local_18[local_90._0_8_]);
      }
    }
  }
  pcVar11 = (char *)std::__cxx11::string::operator[]((ulong)local_70);
  if (*pcVar11 == '\"') {
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_b0,(ulong)local_70);
    std::__cxx11::string::operator=(local_70,local_b0);
    std::__cxx11::string::~string(local_b0);
  }
  kwssys::Directory::Directory((Directory *)in_stack_fffffffffffff770);
  pcVar11 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,pcVar11,&local_e1);
  local_c0 = kwssys::Directory::Load
                       ((Directory *)CONCAT17(in_stack_fffffffffffff80f,in_stack_fffffffffffff808),
                        in_stack_fffffffffffff800,in_stack_fffffffffffff7f8);
  bVar3 = kwssys::Status::operator_cast_to_bool((Status *)0x19e5b8);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  if (bVar3) {
    std::__cxx11::string::string(local_108,local_70);
    std::__cxx11::string::size();
    pcVar11 = (char *)std::__cxx11::string::operator[]((ulong)local_108);
    if (*pcVar11 != '/') {
      std::__cxx11::string::operator+=(local_108,"/");
    }
    local_130[0x24] = (string)0x0;
    local_130[0x25] = (string)0x0;
    local_130[0x26] = (string)0x0;
    local_130[0x27] = (string)0x0;
    for (; uVar12 = (ulong)(uint)local_130._36_4_,
        uVar13 = kwssys::Directory::GetNumberOfFiles((Directory *)0x19e702), uVar12 < uVar13;
        local_130._36_4_ = local_130._36_4_ + 1) {
      pcVar11 = kwssys::Directory::GetFile
                          ((Directory *)in_stack_fffffffffffff770,
                           CONCAT17(in_stack_fffffffffffff76f,
                                    CONCAT16(in_stack_fffffffffffff76e,in_stack_fffffffffffff768)));
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_130,pcVar11,&local_131);
      std::allocator<char>::~allocator((allocator<char> *)&local_131);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff798,in_stack_fffffffffffff790);
      bVar3 = std::operator!=(in_stack_fffffffffffff770,
                              (char *)CONCAT17(in_stack_fffffffffffff76f,
                                               CONCAT16(in_stack_fffffffffffff76e,
                                                        in_stack_fffffffffffff768)));
      if ((((bVar3) &&
           (bVar3 = std::operator!=(in_stack_fffffffffffff770,
                                    (char *)CONCAT17(in_stack_fffffffffffff76f,
                                                     CONCAT16(in_stack_fffffffffffff76e,
                                                              in_stack_fffffffffffff768))), bVar3))
          && (bVar3 = std::operator!=(in_stack_fffffffffffff770,
                                      (char *)CONCAT17(in_stack_fffffffffffff76f,
                                                       CONCAT16(in_stack_fffffffffffff76e,
                                                                in_stack_fffffffffffff768))), bVar3)
          ) && (bVar3 = std::operator!=(in_stack_fffffffffffff770,
                                        (char *)CONCAT17(in_stack_fffffffffffff76f,
                                                         CONCAT16(in_stack_fffffffffffff76e,
                                                                  in_stack_fffffffffffff768))),
               bVar3)) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff798,in_stack_fffffffffffff790);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffff770,
                    (value_type *)
                    CONCAT17(in_stack_fffffffffffff76f,
                             CONCAT16(in_stack_fffffffffffff76e,in_stack_fffffffffffff768)));
        std::__cxx11::string::~string(local_178);
      }
      std::__cxx11::string::~string(local_158);
      std::__cxx11::string::~string(local_130);
    }
    std::__cxx11::string::~string(local_108);
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT17(in_stack_fffffffffffff787,
                            CONCAT16(in_stack_fffffffffffff786,
                                     CONCAT15(in_stack_fffffffffffff785,
                                              CONCAT14(in_stack_fffffffffffff784,
                                                       in_stack_fffffffffffff780)))),
                (value_type *)in_stack_fffffffffffff778);
  }
  std::
  vector<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>,_std::allocator<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>_>
  ::vector((vector<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>,_std::allocator<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>_>
            *)0x19e9a6);
  local_1a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)CONCAT17(in_stack_fffffffffffff76f,
                                  CONCAT16(in_stack_fffffffffffff76e,in_stack_fffffffffffff768)));
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffff770,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)CONCAT17(in_stack_fffffffffffff76f,
                         CONCAT16(in_stack_fffffffffffff76e,in_stack_fffffffffffff768)));
  while( true ) {
    local_3b0._520_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT17(in_stack_fffffffffffff76f,
                           CONCAT16(in_stack_fffffffffffff76e,in_stack_fffffffffffff768)));
    bVar3 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffff770,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffff76f,
                                   CONCAT16(in_stack_fffffffffffff76e,in_stack_fffffffffffff768)));
    if (!bVar3) break;
    local_31[0] = 0;
    std::ifstream::ifstream(local_3b0);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator*(&local_198);
    _Var7 = std::__cxx11::string::c_str();
    std::operator|(_S_bin,_S_in);
    std::ifstream::open(local_3b0,_Var7);
    bVar4 = std::ifstream::is_open();
    if ((bVar4 & 1) == 0) {
      poVar8 = std::operator<<((ostream *)&std::cout,"Cannot open header file: ");
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator*(&local_198);
      pcVar11 = (char *)std::__cxx11::string::c_str();
      poVar8 = std::operator<<(poVar8,pcVar11);
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      local_1 = (_Alloc_hider)0x0;
      local_3b4 = 1;
    }
    else {
      std::istream::seekg((long)local_3b0,_S_beg);
      auVar19 = std::istream::tellg();
      local_3d0 = auVar19;
      local_3c0 = std::fpos::operator_cast_to_long((fpos *)local_3d0);
      std::istream::seekg((long)local_3b0,_S_beg);
      local_3f8._32_8_ = operator_new__(local_3c0 + 1);
      std::istream::read(local_3b0,local_3f8._32_8_);
      ((_Alloc_hider *)local_3f8._32_8_)[local_3c0] = (_Alloc_hider)0x0;
      this_00 = (Parser *)&local_3f9;
      buffer_00 = (pointer)local_3f8._32_8_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_3f8,(char *)buffer_00,(allocator *)this_00);
      std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
      std::__cxx11::string::resize((ulong)local_3f8);
      std::ifstream::close();
      if ((pointer)local_3f8._32_8_ != (pointer)0x0) {
        operator_delete__((void *)local_3f8._32_8_);
      }
      ConvertBufferToWindowsFileType(this_00,(string *)buffer_00);
      std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::vector
                ((vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> *)0x19ecce);
      local_428 = std::__cxx11::string::begin();
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffff770,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)CONCAT17(in_stack_fffffffffffff76f,
                             CONCAT16(in_stack_fffffffffffff76e,in_stack_fffffffffffff768)));
      local_438 = std::__cxx11::string::begin();
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffff770,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)CONCAT17(in_stack_fffffffffffff76f,
                             CONCAT16(in_stack_fffffffffffff76e,in_stack_fffffffffffff768)));
      local_43c = 0;
      local_440 = 0;
      local_448 = -1;
      while( true ) {
        local_450 = std::__cxx11::string::end();
        bVar3 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_stack_fffffffffffff770,
                           (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)CONCAT17(in_stack_fffffffffffff76f,
                                       CONCAT16(in_stack_fffffffffffff76e,in_stack_fffffffffffff768)
                                      ));
        local_841 = false;
        if (bVar3) {
          local_458 = std::__cxx11::string::end();
          local_841 = __gnu_cxx::operator!=
                                ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)in_stack_fffffffffffff770,
                                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)CONCAT17(in_stack_fffffffffffff76f,
                                             CONCAT16(in_stack_fffffffffffff76e,
                                                      in_stack_fffffffffffff768)));
        }
        if (local_841 == false) break;
        pcVar14 = __gnu_cxx::
                  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator*(local_420);
        if ((*pcVar14 == '$') && ((local_1a & 1) != 0)) {
          local_460 = (char *)__gnu_cxx::
                              __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            *)in_stack_fffffffffffff778,
                                           (int)((ulong)in_stack_fffffffffffff770 >> 0x20));
          local_440 = local_440 + 1;
          local_468 = (char *)__gnu_cxx::
                              __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            *)in_stack_fffffffffffff778,
                                           (int)((ulong)in_stack_fffffffffffff770 >> 0x20));
          local_43c = local_43c + 1;
          while( true ) {
            pcVar14 = __gnu_cxx::
                      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator*(local_420);
            local_842 = false;
            if (*pcVar14 != '$') {
              local_470 = std::__cxx11::string::end();
              local_842 = __gnu_cxx::operator!=
                                    ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)in_stack_fffffffffffff770,
                                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)CONCAT17(in_stack_fffffffffffff76f,
                                                 CONCAT16(in_stack_fffffffffffff76e,
                                                          in_stack_fffffffffffff768)));
            }
            if (local_842 == false) break;
            local_478 = (char *)__gnu_cxx::
                                __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)in_stack_fffffffffffff778,
                                             (int)((ulong)in_stack_fffffffffffff770 >> 0x20));
            local_440 = local_440 + 1;
          }
          while( true ) {
            pcVar14 = __gnu_cxx::
                      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator*(&local_430);
            local_843 = false;
            if (*pcVar14 != '$') {
              local_480 = std::__cxx11::string::end();
              local_843 = __gnu_cxx::operator!=
                                    ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)in_stack_fffffffffffff770,
                                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)CONCAT17(in_stack_fffffffffffff76f,
                                                 CONCAT16(in_stack_fffffffffffff76e,
                                                          in_stack_fffffffffffff768)));
            }
            if (local_843 == false) break;
            local_43c = local_43c + 1;
            local_488 = (char *)__gnu_cxx::
                                __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)in_stack_fffffffffffff778,
                                             (int)((ulong)in_stack_fffffffffffff770 >> 0x20));
          }
        }
        pcVar14 = __gnu_cxx::
                  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator*(&local_430);
        cVar1 = *pcVar14;
        pcVar14 = __gnu_cxx::
                  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator*(local_420);
        if (cVar1 == *pcVar14) {
LAB_0019fd38:
          local_688 = std::__cxx11::string::end();
          bVar3 = __gnu_cxx::operator!=
                            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)in_stack_fffffffffffff770,
                             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)CONCAT17(in_stack_fffffffffffff76f,
                                         CONCAT16(in_stack_fffffffffffff76e,
                                                  in_stack_fffffffffffff768)));
          if (bVar3) {
            local_440 = local_440 + 1;
            local_690 = (char *)__gnu_cxx::
                                __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)in_stack_fffffffffffff778,
                                             (int)((ulong)in_stack_fffffffffffff770 >> 0x20));
          }
          local_698 = std::__cxx11::string::end();
          bVar3 = __gnu_cxx::operator!=
                            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)in_stack_fffffffffffff770,
                             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)CONCAT17(in_stack_fffffffffffff76f,
                                         CONCAT16(in_stack_fffffffffffff76e,
                                                  in_stack_fffffffffffff768)));
          if (bVar3) {
            local_43c = local_43c + 1;
            local_6a0 = (char *)__gnu_cxx::
                                __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)in_stack_fffffffffffff778,
                                             (int)((ulong)in_stack_fffffffffffff770 >> 0x20));
          }
        }
        else {
          pcVar14 = __gnu_cxx::
                    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator*(local_420);
          if (*pcVar14 == '<') {
            local_490 = std::__cxx11::string::find(local_3f8,0x1e592b);
            local_498 = std::__cxx11::string::find(local_3f8,0x1e5930);
            if (local_498 == local_440) {
              while( true ) {
                pcVar14 = __gnu_cxx::
                          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator*(local_420);
                local_849 = false;
                if (*pcVar14 != '\n') {
                  local_4a0 = std::__cxx11::string::end();
                  local_849 = __gnu_cxx::operator!=
                                        ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)in_stack_fffffffffffff770,
                                         (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)CONCAT17(in_stack_fffffffffffff76f,
                                                     CONCAT16(in_stack_fffffffffffff76e,
                                                              in_stack_fffffffffffff768)));
                }
                if (local_849 == false) break;
                local_4a8 = (char *)__gnu_cxx::
                                    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)in_stack_fffffffffffff778,
                                                 (int)((ulong)in_stack_fffffffffffff770 >> 0x20));
                local_440 = local_440 + 1;
              }
              while( true ) {
                pcVar14 = __gnu_cxx::
                          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator*(&local_430);
                local_84a = false;
                if (*pcVar14 != '\n') {
                  local_4b0 = std::__cxx11::string::end();
                  local_84a = __gnu_cxx::operator!=
                                        ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)in_stack_fffffffffffff770,
                                         (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)CONCAT17(in_stack_fffffffffffff76f,
                                                     CONCAT16(in_stack_fffffffffffff76e,
                                                              in_stack_fffffffffffff768)));
                }
                if (local_84a == false) break;
                local_43c = local_43c + 1;
                local_4b8 = (char *)__gnu_cxx::
                                    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)in_stack_fffffffffffff778,
                                                 (int)((ulong)in_stack_fffffffffffff770 >> 0x20));
              }
            }
            else {
              if (local_490 != local_440) {
LAB_0019f577:
                local_538 = GetLineNumber(in_stack_fffffffffffff798,
                                          (size_t)in_stack_fffffffffffff790,
                                          SUB81((ulong)in_stack_fffffffffffff788 >> 0x38,0));
                if (local_538 != local_448) {
                  in_stack_fffffffffffff798 = (Parser *)local_3f8;
                  local_448 = local_538;
                  local_540 = std::__cxx11::string::find((char)in_stack_fffffffffffff798,0x20);
                  local_548 = std::__cxx11::string::find((char)in_stack_fffffffffffff798,10);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_568,"",&local_569);
                  std::allocator<char>::~allocator((allocator<char> *)&local_569);
                  if ((local_540 == -1) || (local_548 <= local_540)) {
                    if (local_548 != -1) {
                      std::__cxx11::string::substr((ulong)local_5b0,(ulong)local_3f8);
                      std::__cxx11::string::operator=(local_568,local_5b0);
                      std::__cxx11::string::~string(local_5b0);
                    }
                  }
                  else {
                    std::__cxx11::string::substr((ulong)local_590,(ulong)local_3f8);
                    std::__cxx11::string::operator=(local_568,local_590);
                    std::__cxx11::string::~string(local_590);
                  }
                  in_stack_fffffffffffff788 =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (in_RDI + 0x4f8);
                  local_5b8 = std::__cxx11::string::find((char)in_stack_fffffffffffff788,0x20);
                  local_5c0 = std::__cxx11::string::find((char)in_stack_fffffffffffff788,10);
                  in_stack_fffffffffffff790 =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_5e1;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            ((string *)(local_5e1 + 1),"",(allocator *)in_stack_fffffffffffff790);
                  std::allocator<char>::~allocator((allocator<char> *)local_5e1);
                  if ((local_5b8 == -1) || (local_5c0 <= local_5b8)) {
                    if (local_548 != -1) {
                      std::__cxx11::string::substr((ulong)local_628,in_RDI + 0x4f8);
                      std::__cxx11::string::operator=((string *)(local_5e1 + 1),local_628);
                      std::__cxx11::string::~string(local_628);
                    }
                  }
                  else {
                    std::__cxx11::string::substr((ulong)local_608,in_RDI + 0x4f8);
                    std::__cxx11::string::operator=((string *)(local_5e1 + 1),local_608);
                    std::__cxx11::string::~string(local_608);
                  }
                  _Var6 = std::operator==(in_stack_fffffffffffff790,in_stack_fffffffffffff788);
                  if (_Var6) {
                    std::__cxx11::string::operator=(local_568,"wrong ident");
                  }
                  in_stack_fffffffffffff787 =
                       std::operator==(in_stack_fffffffffffff770,
                                       (char *)CONCAT17(in_stack_fffffffffffff76f,
                                                        CONCAT16(in_stack_fffffffffffff76e,
                                                                 in_stack_fffffffffffff768)));
                  if ((bool)in_stack_fffffffffffff787) {
                    std::__cxx11::string::operator=((string *)(local_5e1 + 1),"[space]");
                  }
                  in_stack_fffffffffffff786 =
                       std::operator==(in_stack_fffffffffffff770,
                                       (char *)CONCAT17(in_stack_fffffffffffff76f,
                                                        CONCAT16(in_stack_fffffffffffff76e,
                                                                 in_stack_fffffffffffff768)));
                  if ((bool)in_stack_fffffffffffff786) {
                    std::__cxx11::string::operator=(local_568,"[space]");
                  }
                  in_stack_fffffffffffff785 =
                       std::operator==(in_stack_fffffffffffff770,
                                       (char *)CONCAT17(in_stack_fffffffffffff76f,
                                                        CONCAT16(in_stack_fffffffffffff76e,
                                                                 in_stack_fffffffffffff768)));
                  if ((bool)in_stack_fffffffffffff785) {
                    std::__cxx11::string::operator=((string *)(local_5e1 + 1),"[end of line]");
                  }
                  in_stack_fffffffffffff784 =
                       std::operator==(in_stack_fffffffffffff770,
                                       (char *)CONCAT17(in_stack_fffffffffffff76f,
                                                        CONCAT16(in_stack_fffffffffffff76e,
                                                                 in_stack_fffffffffffff768)));
                  if ((bool)in_stack_fffffffffffff784) {
                    std::__cxx11::string::operator=(local_568,"[end of line]");
                  }
                  in_stack_fffffffffffff778 =
                       (value_type *)std::__cxx11::string::operator[]((ulong)(local_5e1 + 1));
                  if ((char)in_stack_fffffffffffff778->line == '\0') {
                    std::__cxx11::string::operator=((string *)(local_5e1 + 1),"[no char]");
                  }
                  in_stack_fffffffffffff770 =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       std::__cxx11::string::operator[]((ulong)local_568);
                  if (in_stack_fffffffffffff770->_M_dataplus == (_Alloc_hider)0x0) {
                    std::__cxx11::string::operator=(local_568,"[no char]");
                  }
                  ErrorStruct::ErrorStruct((ErrorStruct *)0x19fad1);
                  local_660 = local_448;
                  local_658 = local_448;
                  local_650 = 0xd;
                  std::__cxx11::string::operator=(local_648,"Header mismatch: ");
                  std::__cxx11::string::operator+=(local_648,(string *)(local_5e1 + 1));
                  std::__cxx11::string::operator+=(local_648," (");
                  std::__cxx11::string::operator+=(local_648,local_568);
                  std::__cxx11::string::operator+=(local_648,") : ");
                  pcVar11 = (char *)std::__cxx11::string::c_str();
                  std::__cxx11::string::operator+=(local_648,pcVar11);
                  std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                            ((vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> *)
                             CONCAT17(in_stack_fffffffffffff787,
                                      CONCAT16(in_stack_fffffffffffff786,
                                               CONCAT15(in_stack_fffffffffffff785,
                                                        CONCAT14(in_stack_fffffffffffff784,
                                                                 in_stack_fffffffffffff780)))),
                             in_stack_fffffffffffff778);
                  local_31[0] = 1;
                  while( true ) {
                    local_668 = std::__cxx11::string::end();
                    bVar3 = __gnu_cxx::operator!=
                                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)in_stack_fffffffffffff770,
                                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)CONCAT17(in_stack_fffffffffffff76f,
                                                   CONCAT16(in_stack_fffffffffffff76e,
                                                            in_stack_fffffffffffff768)));
                    in_stack_fffffffffffff76f = false;
                    if (bVar3) {
                      pcVar14 = __gnu_cxx::
                                __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator*(local_420);
                      in_stack_fffffffffffff76f = *pcVar14 != '\n';
                    }
                    if ((bool)in_stack_fffffffffffff76f == false) break;
                    local_670 = (char *)__gnu_cxx::
                                        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        ::operator++((
                                                  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)in_stack_fffffffffffff778,
                                                  (int)((ulong)in_stack_fffffffffffff770 >> 0x20));
                    local_440 = local_440 + 1;
                  }
                  while( true ) {
                    local_678 = std::__cxx11::string::end();
                    bVar3 = __gnu_cxx::operator!=
                                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)in_stack_fffffffffffff770,
                                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)CONCAT17(in_stack_fffffffffffff76f,
                                                   CONCAT16(in_stack_fffffffffffff76e,
                                                            in_stack_fffffffffffff768)));
                    in_stack_fffffffffffff76e = false;
                    if (bVar3) {
                      pcVar14 = __gnu_cxx::
                                __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator*(&local_430);
                      in_stack_fffffffffffff76e = *pcVar14 != '\n';
                    }
                    if ((bool)in_stack_fffffffffffff76e == false) break;
                    local_43c = local_43c + 1;
                    local_680 = (char *)__gnu_cxx::
                                        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        ::operator++((
                                                  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)in_stack_fffffffffffff778,
                                                  (int)((ulong)in_stack_fffffffffffff770 >> 0x20));
                  }
                  ErrorStruct::~ErrorStruct((ErrorStruct *)0x19fcfb);
                  std::__cxx11::string::~string((string *)(local_5e1 + 1));
                  std::__cxx11::string::~string(local_568);
                }
                goto LAB_0019fd38;
              }
              while( true ) {
                pcVar14 = __gnu_cxx::
                          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator*(local_420);
                local_84b = false;
                if (*pcVar14 != ' ') {
                  local_4c0 = std::__cxx11::string::end();
                  local_84b = __gnu_cxx::operator!=
                                        ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)in_stack_fffffffffffff770,
                                         (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)CONCAT17(in_stack_fffffffffffff76f,
                                                     CONCAT16(in_stack_fffffffffffff76e,
                                                              in_stack_fffffffffffff768)));
                }
                if (local_84b == false) break;
                local_4c8 = (char *)__gnu_cxx::
                                    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)in_stack_fffffffffffff778,
                                                 (int)((ulong)in_stack_fffffffffffff770 >> 0x20));
                local_440 = local_440 + 1;
              }
              while( true ) {
                pcVar14 = __gnu_cxx::
                          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator*(&local_430);
                local_84c = false;
                if (*pcVar14 != ' ') {
                  local_4d0 = std::__cxx11::string::end();
                  local_84c = __gnu_cxx::operator!=
                                        ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)in_stack_fffffffffffff770,
                                         (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)CONCAT17(in_stack_fffffffffffff76f,
                                                     CONCAT16(in_stack_fffffffffffff76e,
                                                              in_stack_fffffffffffff768)));
                }
                if (local_84c == false) break;
                local_43c = local_43c + 1;
                local_4d8 = (char *)__gnu_cxx::
                                    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)in_stack_fffffffffffff778,
                                                 (int)((ulong)in_stack_fffffffffffff770 >> 0x20));
              }
            }
          }
          else {
            if ((local_19 & 1) != 0) goto LAB_0019f577;
            pcVar14 = __gnu_cxx::
                      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator*(local_420);
            if (*pcVar14 != ' ') {
              pcVar14 = __gnu_cxx::
                        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator*(&local_430);
              if (*pcVar14 != ' ') goto LAB_0019f577;
            }
            local_4d9 = 1;
            pcVar14 = __gnu_cxx::
                      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator*(&local_430);
            if (*pcVar14 == ' ') {
              local_4e8._M_current = local_430._M_current;
              while( true ) {
                local_4f0 = std::__cxx11::string::end();
                bVar5 = __gnu_cxx::operator!=
                                  ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)in_stack_fffffffffffff770,
                                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)CONCAT17(in_stack_fffffffffffff76f,
                                               CONCAT16(in_stack_fffffffffffff76e,
                                                        in_stack_fffffffffffff768)));
                bVar3 = false;
                if (bVar5) {
                  pcVar14 = __gnu_cxx::
                            __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator*(&local_4e8);
                  bVar3 = *pcVar14 != '\n';
                }
                if (!bVar3) goto LAB_0019f441;
                pcVar14 = __gnu_cxx::
                          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator*(&local_4e8);
                if (*pcVar14 != ' ') break;
                local_4f8 = (char *)__gnu_cxx::
                                    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)in_stack_fffffffffffff778,
                                                 (int)((ulong)in_stack_fffffffffffff770 >> 0x20));
              }
              local_4d9 = 0;
            }
            else {
              pcVar14 = __gnu_cxx::
                        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator*(local_420);
              if (*pcVar14 == ' ') {
                local_500._M_current = local_420[0]._M_current;
                while( true ) {
                  local_508 = std::__cxx11::string::end();
                  bVar5 = __gnu_cxx::operator!=
                                    ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)in_stack_fffffffffffff770,
                                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)CONCAT17(in_stack_fffffffffffff76f,
                                                 CONCAT16(in_stack_fffffffffffff76e,
                                                          in_stack_fffffffffffff768)));
                  bVar3 = false;
                  if (bVar5) {
                    pcVar14 = __gnu_cxx::
                              __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::operator*(&local_500);
                    bVar3 = *pcVar14 != '\n';
                  }
                  if (!bVar3) goto LAB_0019f441;
                  pcVar14 = __gnu_cxx::
                            __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator*(&local_500);
                  if (*pcVar14 != ' ') break;
                  local_510 = (char *)__gnu_cxx::
                                      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator++((
                                                  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)in_stack_fffffffffffff778,
                                                  (int)((ulong)in_stack_fffffffffffff770 >> 0x20));
                }
                local_4d9 = 0;
              }
            }
LAB_0019f441:
            if ((local_4d9 & 1) != 0) goto LAB_0019f577;
            while( true ) {
              local_518 = std::__cxx11::string::end();
              bVar5 = __gnu_cxx::operator!=
                                ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)in_stack_fffffffffffff770,
                                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)CONCAT17(in_stack_fffffffffffff76f,
                                             CONCAT16(in_stack_fffffffffffff76e,
                                                      in_stack_fffffffffffff768)));
              bVar3 = false;
              if (bVar5) {
                pcVar14 = __gnu_cxx::
                          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator*(local_420);
                bVar3 = *pcVar14 != '\n';
              }
              if (!bVar3) break;
              local_520 = (char *)__gnu_cxx::
                                  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                *)in_stack_fffffffffffff778,
                                               (int)((ulong)in_stack_fffffffffffff770 >> 0x20));
              local_440 = local_440 + 1;
            }
            while( true ) {
              local_528 = std::__cxx11::string::end();
              bVar5 = __gnu_cxx::operator!=
                                ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)in_stack_fffffffffffff770,
                                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)CONCAT17(in_stack_fffffffffffff76f,
                                             CONCAT16(in_stack_fffffffffffff76e,
                                                      in_stack_fffffffffffff768)));
              bVar3 = false;
              if (bVar5) {
                pcVar14 = __gnu_cxx::
                          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator*(&local_430);
                bVar3 = *pcVar14 != '\n';
              }
              if (!bVar3) break;
              local_43c = local_43c + 1;
              local_530 = (char *)__gnu_cxx::
                                  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                *)in_stack_fffffffffffff778,
                                               (int)((ulong)in_stack_fffffffffffff770 >> 0x20));
            }
          }
        }
      }
      local_6a8 = std::__cxx11::string::end();
      bVar3 = __gnu_cxx::operator==
                        ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_fffffffffffff770,
                         (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)CONCAT17(in_stack_fffffffffffff76f,
                                     CONCAT16(in_stack_fffffffffffff76e,in_stack_fffffffffffff768)))
      ;
      if (bVar3) {
        ErrorStruct::ErrorStruct((ErrorStruct *)0x19fe3b);
        local_6e0 = 1;
        local_6d8 = 1;
        local_6d0 = 0xd;
        std::__cxx11::string::operator=(local_6c8,"The header is incomplete");
        std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                  ((vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> *)
                   CONCAT17(in_stack_fffffffffffff787,
                            CONCAT16(in_stack_fffffffffffff786,
                                     CONCAT15(in_stack_fffffffffffff785,
                                              CONCAT14(in_stack_fffffffffffff784,
                                                       in_stack_fffffffffffff780)))),
                   in_stack_fffffffffffff778);
        local_31[0] = 1;
        ErrorStruct::~ErrorStruct((ErrorStruct *)0x19fea5);
      }
      if ((local_31[0] & 1) == 0) {
        pbVar15 = __gnu_cxx::
                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&local_198);
        std::__cxx11::string::operator=((string *)(in_RDI + 0x5a8),(string *)pbVar15);
        local_6f0 = (ErrorStruct *)
                    std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::begin
                              ((vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> *)
                               CONCAT17(in_stack_fffffffffffff76f,
                                        CONCAT16(in_stack_fffffffffffff76e,in_stack_fffffffffffff768
                                                )));
        __gnu_cxx::
        __normal_iterator<kws::ErrorStruct_const*,std::vector<kws::ErrorStruct,std::allocator<kws::ErrorStruct>>>
        ::__normal_iterator<kws::ErrorStruct*>
                  ((__normal_iterator<const_kws::ErrorStruct_*,_std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>
                    *)in_stack_fffffffffffff770,
                   (__normal_iterator<kws::ErrorStruct_*,_std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>
                    *)CONCAT17(in_stack_fffffffffffff76f,
                               CONCAT16(in_stack_fffffffffffff76e,in_stack_fffffffffffff768)));
        while( true ) {
          local_6f8 = (ErrorStruct *)
                      std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::end
                                ((vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> *)
                                 CONCAT17(in_stack_fffffffffffff76f,
                                          CONCAT16(in_stack_fffffffffffff76e,
                                                   in_stack_fffffffffffff768)));
          bVar3 = __gnu_cxx::operator!=
                            ((__normal_iterator<const_kws::ErrorStruct_*,_std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>
                              *)in_stack_fffffffffffff770,
                             (__normal_iterator<kws::ErrorStruct_*,_std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>
                              *)CONCAT17(in_stack_fffffffffffff76f,
                                         CONCAT16(in_stack_fffffffffffff76e,
                                                  in_stack_fffffffffffff768)));
          if (!bVar3) break;
          __gnu_cxx::
          __normal_iterator<const_kws::ErrorStruct_*,_std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>
          ::operator*(&local_6e8);
          std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                    ((vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> *)
                     CONCAT17(in_stack_fffffffffffff787,
                              CONCAT16(in_stack_fffffffffffff786,
                                       CONCAT15(in_stack_fffffffffffff785,
                                                CONCAT14(in_stack_fffffffffffff784,
                                                         in_stack_fffffffffffff780)))),
                     in_stack_fffffffffffff778);
          local_700 = (ErrorStruct *)
                      __gnu_cxx::
                      __normal_iterator<const_kws::ErrorStruct_*,_std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>
                      ::operator++((__normal_iterator<const_kws::ErrorStruct_*,_std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>
                                    *)in_stack_fffffffffffff778,
                                   (int)((ulong)in_stack_fffffffffffff770 >> 0x20));
        }
        local_1 = (_Alloc_hider)0x1;
        local_3b4 = 1;
      }
      else {
        std::
        vector<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>,_std::allocator<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>_>
        ::push_back((vector<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>,_std::allocator<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>_>
                     *)CONCAT17(in_stack_fffffffffffff787,
                                CONCAT16(in_stack_fffffffffffff786,
                                         CONCAT15(in_stack_fffffffffffff785,
                                                  CONCAT14(in_stack_fffffffffffff784,
                                                           in_stack_fffffffffffff780)))),
                    (value_type *)in_stack_fffffffffffff778);
        local_708 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __gnu_cxx::
                    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)in_stack_fffffffffffff778,
                                 (int)((ulong)in_stack_fffffffffffff770 >> 0x20));
        local_3b4 = 0;
      }
      std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::~vector
                ((vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> *)
                 CONCAT17(in_stack_fffffffffffff787,
                          CONCAT16(in_stack_fffffffffffff786,
                                   CONCAT15(in_stack_fffffffffffff785,
                                            CONCAT14(in_stack_fffffffffffff784,
                                                     in_stack_fffffffffffff780)))));
      std::__cxx11::string::~string((string *)local_3f8);
    }
    std::ifstream::~ifstream(local_3b0);
    if (local_3b4 != 0) goto LAB_001a023a;
  }
  local_70c = 0;
  local_710 = 9999999;
  local_714 = 0;
  local_728 = (vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> *)
              std::
              vector<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>,_std::allocator<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>_>
              ::begin((vector<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>,_std::allocator<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>_>
                       *)CONCAT17(in_stack_fffffffffffff76f,
                                  CONCAT16(in_stack_fffffffffffff76e,in_stack_fffffffffffff768)));
  __gnu_cxx::
  __normal_iterator<std::vector<kws::ErrorStruct,std::allocator<kws::ErrorStruct>>const*,std::vector<std::vector<kws::ErrorStruct,std::allocator<kws::ErrorStruct>>,std::allocator<std::vector<kws::ErrorStruct,std::allocator<kws::ErrorStruct>>>>>
  ::__normal_iterator<std::vector<kws::ErrorStruct,std::allocator<kws::ErrorStruct>>*>
            ((__normal_iterator<const_std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_*,_std::vector<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>,_std::allocator<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>_>_>
              *)in_stack_fffffffffffff770,
             (__normal_iterator<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_*,_std::vector<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>,_std::allocator<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>_>_>
              *)CONCAT17(in_stack_fffffffffffff76f,
                         CONCAT16(in_stack_fffffffffffff76e,in_stack_fffffffffffff768)));
  while( true ) {
    local_730 = (vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> *)
                std::
                vector<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>,_std::allocator<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>_>
                ::end((vector<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>,_std::allocator<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>_>
                       *)CONCAT17(in_stack_fffffffffffff76f,
                                  CONCAT16(in_stack_fffffffffffff76e,in_stack_fffffffffffff768)));
    bVar3 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_*,_std::vector<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>,_std::allocator<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>_>_>
                        *)in_stack_fffffffffffff770,
                       (__normal_iterator<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_*,_std::vector<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>,_std::allocator<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffff76f,
                                   CONCAT16(in_stack_fffffffffffff76e,in_stack_fffffffffffff768)));
    if (!bVar3) break;
    pvVar16 = __gnu_cxx::
              __normal_iterator<const_std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_*,_std::vector<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>,_std::allocator<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>_>_>
              ::operator*(&local_720);
    sVar17 = std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::size(pvVar16);
    if ((int)sVar17 < local_710) {
      local_70c = local_714;
      pvVar16 = __gnu_cxx::
                __normal_iterator<const_std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_*,_std::vector<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>,_std::allocator<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>_>_>
                ::operator*(&local_720);
      sVar17 = std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::size(pvVar16);
      local_710 = (int)sVar17;
    }
    local_714 = local_714 + 1;
    local_738 = (vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> *)
                __gnu_cxx::
                __normal_iterator<const_std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_*,_std::vector<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>,_std::allocator<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>_>_>
                ::operator++((__normal_iterator<const_std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_*,_std::vector<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>,_std::allocator<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>_>_>
                              *)in_stack_fffffffffffff778,
                             (int)((ulong)in_stack_fffffffffffff770 >> 0x20));
  }
  std::
  vector<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>,_std::allocator<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>_>
  ::operator[](&local_190,(ulong)local_70c);
  std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::begin
            ((vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> *)
             CONCAT17(in_stack_fffffffffffff76f,
                      CONCAT16(in_stack_fffffffffffff76e,in_stack_fffffffffffff768)));
  __gnu_cxx::
  __normal_iterator<kws::ErrorStruct_const*,std::vector<kws::ErrorStruct,std::allocator<kws::ErrorStruct>>>
  ::__normal_iterator<kws::ErrorStruct*>
            ((__normal_iterator<const_kws::ErrorStruct_*,_std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>
              *)in_stack_fffffffffffff770,
             (__normal_iterator<kws::ErrorStruct_*,_std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>
              *)CONCAT17(in_stack_fffffffffffff76f,
                         CONCAT16(in_stack_fffffffffffff76e,in_stack_fffffffffffff768)));
  while( true ) {
    std::
    vector<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>,_std::allocator<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>_>
    ::operator[](&local_190,(ulong)local_70c);
    std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::end
              ((vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> *)
               CONCAT17(in_stack_fffffffffffff76f,
                        CONCAT16(in_stack_fffffffffffff76e,in_stack_fffffffffffff768)));
    bVar3 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_kws::ErrorStruct_*,_std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>
                        *)in_stack_fffffffffffff770,
                       (__normal_iterator<kws::ErrorStruct_*,_std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>
                        *)CONCAT17(in_stack_fffffffffffff76f,
                                   CONCAT16(in_stack_fffffffffffff76e,in_stack_fffffffffffff768)));
    if (!bVar3) break;
    __gnu_cxx::
    __normal_iterator<const_kws::ErrorStruct_*,_std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>
    ::operator*(&local_740);
    std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
              ((vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> *)
               CONCAT17(in_stack_fffffffffffff787,
                        CONCAT16(in_stack_fffffffffffff786,
                                 CONCAT15(in_stack_fffffffffffff785,
                                          CONCAT14(in_stack_fffffffffffff784,
                                                   in_stack_fffffffffffff780)))),
               in_stack_fffffffffffff778);
    __gnu_cxx::
    __normal_iterator<const_kws::ErrorStruct_*,_std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>
    ::operator++((__normal_iterator<const_kws::ErrorStruct_*,_std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>
                  *)in_stack_fffffffffffff778,(int)((ulong)in_stack_fffffffffffff770 >> 0x20));
  }
  pvVar18 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](&local_50,(ulong)local_70c);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x5a8),(string *)pvVar18);
  local_1 = (local_31[0] ^ 0xff) & 1;
  local_3b4 = 1;
LAB_001a023a:
  std::
  vector<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>,_std::allocator<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>_>
  ::~vector((vector<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>,_std::allocator<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>_>
             *)CONCAT17(in_stack_fffffffffffff787,
                        CONCAT16(in_stack_fffffffffffff786,
                                 CONCAT15(in_stack_fffffffffffff785,
                                          CONCAT14(in_stack_fffffffffffff784,
                                                   in_stack_fffffffffffff780)))));
  kwssys::Directory::~Directory((Directory *)in_stack_fffffffffffff770);
  std::__cxx11::string::~string(local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT17(in_stack_fffffffffffff787,
                        CONCAT16(in_stack_fffffffffffff786,
                                 CONCAT15(in_stack_fffffffffffff785,
                                          CONCAT14(in_stack_fffffffffffff784,
                                                   in_stack_fffffffffffff780)))));
  goto LAB_001a02a6;
}

Assistant:

bool Parser::CheckHeader(const char* filename, bool considerSpaceEOL,bool useCVS)
{
  m_TestsDone[HEADER] = true;
  constexpr size_t length = 255;
  char* val = new char[length];
  snprintf(val,length,"The header should respect the template");
  m_TestsDescription[HEADER] = val;
  delete [] val;

  bool hasError = false;
  if(!filename)
    {
    std::cout << "CheckHeader(): Please specify an header file or a directory containing headers" << std::endl;
    return false;
    }

  std::vector<std::string> fileNames;
  
  // if there is no space in the name (i.e on linux) we remove the
  // '"' if any. 
  std::string headerFilename = filename;
  if(headerFilename.find(' ') == std::string::npos)
    {
    headerFilename = "";
    for(unsigned long j=0;j<strlen(filename);j++)
      {
      if(filename[j] != '\"')
        {
        headerFilename+=filename[j];
        }
      }
    }

  // Remove quotes if any on linux
  #ifndef WIN32
    if(headerFilename[0] == '"')
      {
      headerFilename = headerFilename.substr(1,headerFilename.size()-2);
      }
  #endif

  // Check if we have a directory or header
  kwssys::Directory directory;
  if(directory.Load(headerFilename.c_str()))
    {
    std::string dirname = headerFilename;
    if(dirname[dirname.size()-1] != '/')
      {
      dirname += "/";
      }

    for(unsigned int i=0;i<directory.GetNumberOfFiles();i++)
      {
      std::string file = directory.GetFile(i);
      std::string fullpath = dirname+file;
      
      if(file!=".." && file!="." && file!="CVS"&& file!= ".svn")
        {
        fileNames.push_back(dirname+file);
        }
      }
    }
  else
    {
    fileNames.push_back(headerFilename);
    }

  // Create a temporary vector of errors
  std::vector<ErrorVectorType> tempErrors;

  std::vector<std::string>::const_iterator itFilename = fileNames.begin();  
  while(itFilename != fileNames.end())
    {
    hasError = false;

    // Read the header file
    std::ifstream file;
    file.open((*itFilename).c_str(), std::ios::binary | std::ios::in);
    if(!file.is_open())
      {
      std::cout << "Cannot open header file: " << (*itFilename).c_str() << std::endl;
      return false;
      }

    file.seekg(0,std::ios::end);
    unsigned long fileSize = file.tellg();
    file.seekg(0,std::ios::beg);

    char* buf = new char[fileSize+1];
    file.read(buf,fileSize);
    buf[fileSize] = 0;
    std::string buffer(buf);
    buffer.resize(fileSize);
    file.close();
    delete [] buf;

    this->ConvertBufferToWindowsFileType(buffer);
    
    ErrorVectorType  tempErrorVector;

    // Check the file char by char
    std::string::const_iterator ith = buffer.begin();
    std::string::const_iterator it = m_Buffer.begin();

    unsigned int pos = 0;
    unsigned int posh = 0;
    long line = -1;


    while((ith != buffer.end()) && (it != m_Buffer.end()))
      {
      // if we have cvs
      if((*ith == '$') && useCVS)
        {
        ith++;
        posh++;
        it++;
        pos++;
        while(((*ith) != '$') && (ith != buffer.end()))
          {
          ith++;
          posh++;
          }
        while(((*it) != '$') && (it != m_Buffer.end()))
          {
          pos++;
          it++;
          }
        //continue;
        }
       
      if((*it) != (*ith))
        {
        // Check if we have a <NA> tag
        if((*ith) == '<')
          {
          auto pos2 = static_cast<long int>(buffer.find("<NA>", posh));
          auto pos3 = static_cast<long int>(buffer.find("<NA>\n", posh));

          // We skip the line
          if(pos3 == static_cast<long int>(posh))
            {
            while(((*ith) != '\n') && (ith != buffer.end()))
              {
              ith++;
              posh++;
              }
            while(((*it) != '\n') && (it != m_Buffer.end()))
              {
              pos++;
              it++;
              }
            continue;
            }
          // if we have the tag we skip the word
          else if(pos2 == static_cast<long int>(posh))
            {
            while(((*ith) != ' ') && (ith != buffer.end()))
              {
              ith++;
              posh++;
              }
            while(((*it) != ' ') && (it != m_Buffer.end()))
              {
              pos++;
              it++;
              }
            continue;
            }
          }
        // if we should not check the spaces at the end of line
        else if( (!considerSpaceEOL)
          && ((*ith == ' ') || (*it == ' '))
          )
          {
          // search if we are effectively at the end of the line
          bool isAtEnd = true;
          if(*it == ' ')
            {
            std::string::const_iterator ittemp = it;
            while((ittemp != m_Buffer.end()) && ((*ittemp) != '\n'))
              {
              if(*ittemp != ' ')
                {
                isAtEnd = false;
                break;
                }
              ittemp++;
              }
            }
          else if(*ith == ' ')
            {
            std::string::const_iterator ittemp = ith;
            while((ittemp != buffer.end()) && ((*ittemp) != '\n'))
              {
              if(*ittemp != ' ')
                {
                isAtEnd = false;
                break;
                }
              ittemp++;
              }
            }

          // If we are at the end we skip the line
          if(!isAtEnd)
            {
            while((ith != buffer.end()) && ((*ith) != '\n'))
              {
              ith++;
              posh++;
              }
            while((it != m_Buffer.end()) && ((*it) != '\n'))
              {
              pos++;
              it++;
              }
            continue;
            }
          }

        // Report the error
        //hasError = true;

        // We report the wrong word and the line
        long l = this->GetLineNumber(pos);
        if(l != line)
          {
          line = l;
          // Find the word
          auto poshw = static_cast<long int>(buffer.find(' ', posh));
          auto poshw2 = static_cast<long int>(buffer.find('\n', posh));
          std::string wordh = "";
          if(poshw!= -1 && poshw < poshw2)
            {
            wordh = buffer.substr(posh,poshw-posh);
            }
          else if (poshw2 != -1)
            {
            wordh = buffer.substr(posh,poshw2-posh-1);
            }

          // Find the word
            auto posw = static_cast<long int>(m_Buffer.find(' ', pos));
            auto posw2 = static_cast<long int>(m_Buffer.find('\n', pos));
            std::string word = "";
            if (posw != -1 && posw < posw2) {
              word = m_Buffer.substr(pos, posw - pos);
            }
          else if (poshw2 != -1)
            {
            word = m_Buffer.substr(pos,posw2-pos-1);
            }

          if(word == wordh)
            {
            wordh = "wrong ident";
            }
         
          if(word == " ")
            {
            word = "[space]";
            }
          if(wordh == " ")
            {
            wordh = "[space]";
            }
         if(word == "\r")
            {
            word = "[end of line]";
            }
          if(wordh == "\r")
            {
            wordh = "[end of line]";
            }
          
          if(word[0] == 0)
            {
            word = "[no char]";
            }
          if(wordh[0] == 0)
            {
            wordh = "[no char]";
            }

          Error error;
          error.line = line;
          error.line2 = error.line;
          error.number = HEADER;
          error.description = "Header mismatch: ";
          error.description += word;
          error.description += " (";
          error.description += wordh;
          error.description += ") : ";
          error.description += headerFilename.c_str();
          tempErrorVector.push_back(error);
          hasError = true;

          // We skip that line   
          while((ith != buffer.end()) && ((*ith) != '\n'))
            {
            ith++;
            posh++;
            }
          while((it != m_Buffer.end()) && ((*it) != '\n'))
            {
            pos++;
            it++;
            }
          }
        }

      if(ith != buffer.end())
        {
        posh++;
        ith++;
        }

      if(it != m_Buffer.end())
        {
        pos++;
        it++;
        }
      }

    if(it == m_Buffer.end())
      {
      Error error;
      error.line = 1;
      error.line2 = error.line;
      error.number = HEADER;
      error.description = "The header is incomplete";
      tempErrorVector.push_back(error);
      hasError = true;
      }

    // If we don't have any errors we return the current errors
    if(!hasError)
      {
      m_HeaderFilename = *itFilename;
      ErrorVectorType::const_iterator itErr = tempErrorVector.begin();
      while(itErr != tempErrorVector.end())
        {
        m_ErrorList.push_back(*itErr);
        itErr++;
        }
      return true;
      }

    tempErrors.push_back(tempErrorVector);

    itFilename++;
    } // end loop of filenames

  // We check the less errors we can have
  unsigned int header=0;
  int minErrors = 9999999;
  unsigned int i=0;
  std::vector<ErrorVectorType>::const_iterator itErrV = tempErrors.begin();
  while(itErrV != tempErrors.end())
    {
    if((int)(*itErrV).size() < minErrors)
      {
      header = i;
      minErrors = static_cast<int>((*itErrV).size());
      }
    i++;
    itErrV++;
    }
 
  ErrorVectorType::const_iterator itErr = tempErrors[header].begin();
  while(itErr != tempErrors[header].end())
    {
    m_ErrorList.push_back(*itErr);
    itErr++;
    }

  m_HeaderFilename = fileNames[header];
  return !hasError;
}